

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_oram.h
# Opt level: O2

void __thiscall TreeOram::TreeOram(TreeOram *this,int _logN,int buck_size,int _h)

{
  mt19937 *this_00;
  result_type rVar1;
  uint uVar2;
  result_type_conflict __sd;
  Bucket<int> *pBVar3;
  pointer piVar4;
  int iVar5;
  Bucket<int> *local_48;
  int local_3c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_38;
  
  this_00 = &this->rg;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c = buck_size;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this_00);
  (this->uni)._M_param = (param_type)0x7fffffff00000000;
  __sd = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this_00,__sd);
  this->logN = _logN;
  this->h = _h;
  this->N = 1 << ((byte)_logN & 0x1f);
  (this->uni)._M_param = (param_type)((ulong)(uint)~(-1 << ((char)_h - 1U & 0x1f)) << 0x20);
  local_38 = this_00;
  pBVar3 = (Bucket<int> *)operator_new(0x20);
  Bucket<int>::Bucket(pBVar3,0x32);
  local_48 = pBVar3;
  std::vector<Bucket<int>*,std::allocator<Bucket<int>*>>::emplace_back<Bucket<int>*>
            ((vector<Bucket<int>*,std::allocator<Bucket<int>*>> *)this,&local_48);
  iVar5 = 1;
  while( true ) {
    if (1 << ((byte)this->h & 0x1f) <= iVar5) break;
    pBVar3 = (Bucket<int> *)operator_new(0x20);
    Bucket<int>::Bucket(pBVar3,local_3c);
    local_48 = pBVar3;
    std::vector<Bucket<int>*,std::allocator<Bucket<int>*>>::emplace_back<Bucket<int>*>
              ((vector<Bucket<int>*,std::allocator<Bucket<int>*>> *)this,&local_48);
    iVar5 = iVar5 + 1;
  }
  local_48 = (Bucket<int> *)CONCAT44(local_48._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->index,(long)this->N + 1,(value_type_conflict *)&local_48);
  piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  while( true ) {
    if ((ulong)((long)(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= (ulong)uVar2) break;
    rVar1 = std::uniform_int_distribution<int>::operator()(&this->uni,local_38);
    piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4[uVar2] = rVar1;
    uVar2 = uVar2 + 1;
  }
  this->stash = *(this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

TreeOram(int _logN, int buck_size, int _h)
      {
         rg.seed(time(0));
         logN = _logN;
         h = _h;
         N = 1<<logN;
         uni = std::uniform_int_distribution<int>(0, (1<<(h-1))-1);
         tree.push_back(new Bucket<int>(STASH_CAP));
         for(int i = 1; i < 1<<h; ++i)
            tree.push_back(new Bucket<int>(buck_size));
         index.assign(N+1, -1);
         for(unsigned int i = 0; i < index.size(); ++i)
            index[i] = uni(rg);
         stash = tree[0];
      }